

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O3

int64_t __thiscall
hta::storage::file::Metric::find_index_before_or_on_binary
          (Metric *this,TimePoint t,int64_t left,int64_t right,int64_t sz)

{
  ssize_t sVar1;
  long lVar2;
  int64_t iVar3;
  long lVar4;
  RawFile *this_00;
  
  if (left < right) {
    this_00 = &this->file_raw_;
    iVar3 = right;
    do {
      sVar1 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
                        (this_00,(int)left,(void *)0x0,right);
      if ((long)t.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r < sVar1) {
        __assert_fail("get_raw_ts(left) <= t",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                      ,0x53,
                      "int64_t hta::storage::file::Metric::find_index_before_or_on_binary(TimePoint, int64_t, int64_t, int64_t)"
                     );
      }
      if ((iVar3 != sz) &&
         (sVar1 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
                            (this_00,(int)iVar3,(void *)0x0,right),
         sVar1 <= (long)t.
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        .__d.__r)) {
        __assert_fail("right == sz || t < get_raw_ts(right)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                      ,0x54,
                      "int64_t hta::storage::file::Metric::find_index_before_or_on_binary(TimePoint, int64_t, int64_t, int64_t)"
                     );
      }
      if (iVar3 - left == 1) {
        return left;
      }
      lVar2 = (iVar3 + left) / 2;
      if (sz <= lVar2) {
        __assert_fail("pivot < sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                      ,0x5a,
                      "int64_t hta::storage::file::Metric::find_index_before_or_on_binary(TimePoint, int64_t, int64_t, int64_t)"
                     );
      }
      sVar1 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
                        (this_00,(int)lVar2,(void *)0x0,right);
      lVar4 = lVar2;
      if (sVar1 <= (long)t.
                         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         .__d.__r) {
        lVar4 = iVar3;
        left = lVar2;
      }
      iVar3 = lVar4;
    } while (left < lVar4);
  }
  __assert_fail("left < right",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                ,0x51,
                "int64_t hta::storage::file::Metric::find_index_before_or_on_binary(TimePoint, int64_t, int64_t, int64_t)"
               );
}

Assistant:

int64_t Metric::find_index_before_or_on_binary(TimePoint t, int64_t left, int64_t right, int64_t sz)
{
    // left < right means right != 0
    // assumes monotonicity ts(left) < ts(right)
    // invariant ts(left) <= t < ts(right)
    // right can be size() // out of range, but the pivot can never be
    assert(left < right);
    // TODO expensive, use extra debug macro
    assert(get_raw_ts(left) <= t);
    assert(right == sz || t < get_raw_ts(right));
    if (right - left == 1)
    {
        return left;
    }
    auto pivot = (left + right) / 2;
    assert(pivot < sz);
    TimePoint t_pivot = get_raw_ts(pivot);
    if (t >= t_pivot)
    {
        return find_index_before_or_on_binary(t, pivot, right, sz);
    }
    else
    {
        return find_index_before_or_on_binary(t, left, pivot, sz);
    }
}